

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::Parse<0u,rapidjson::UTF8<char>>
          (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,Ch *str,size_t length)

{
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> is;
  MemoryStream ms;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> local_30;
  MemoryStream local_28;
  
  local_30.is_ = &local_28;
  local_28.end_ = str + length;
  local_28.src_ = str;
  if ((length != 0) && (*str == -0x11)) {
    local_28.src_ = str + 1;
  }
  if (local_28.src_ != local_28.end_) {
    if (*local_28.src_ == -0x45) {
      local_28.src_ = local_28.src_ + 1;
    }
    if ((local_28.src_ != local_28.end_) && (*local_28.src_ == -0x41)) {
      local_28.src_ = local_28.src_ + 1;
    }
  }
  local_28.begin_ = str;
  local_28.size_ = length;
  ParseStream<0u,rapidjson::UTF8<char>,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
            (this,&local_30);
  return (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *)this;
}

Assistant:

GenericDocument& Parse(const typename SourceEncoding::Ch* str, size_t length) {
        RAPIDJSON_ASSERT(!(parseFlags & kParseInsituFlag));
        MemoryStream ms(reinterpret_cast<const char*>(str), length * sizeof(typename SourceEncoding::Ch));
        EncodedInputStream<SourceEncoding, MemoryStream> is(ms);
        ParseStream<parseFlags, SourceEncoding>(is);
        return *this;
    }